

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURL_conflict * curl_easy_duphandle(Curl_easy *data)

{
  curl_mimepart *part;
  undefined1 *puVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  Curl_easy *easy;
  size_t length;
  char *pcVar4;
  CookieInfo *pCVar5;
  curl_slist *pcVar6;
  long lVar7;
  
  easy = (Curl_easy *)(*Curl_ccalloc)(1,0x1458);
  if (easy == (Curl_easy *)0x0) {
    return (CURL_conflict *)0x0;
  }
  (easy->set).buffer_size = (data->set).buffer_size;
  memcpy(&easy->set,&data->set,0x8f0);
  part = &(easy->set).mimepost;
  Curl_mime_initpart(part,easy);
  memset((easy->set).str,0,0x278);
  lVar7 = 0x730;
  CVar3 = CURLE_OUT_OF_MEMORY;
  do {
    CVar2 = Curl_setstropt((char **)((long)&easy->magic + lVar7),
                           *(char **)((long)&data->magic + lVar7));
    if (CVar2 != CURLE_OK) goto LAB_0052cce5;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x990);
  (easy->set).blobs[6] = (curl_blob *)0x0;
  (easy->set).blobs[7] = (curl_blob *)0x0;
  (easy->set).blobs[4] = (curl_blob *)0x0;
  (easy->set).blobs[5] = (curl_blob *)0x0;
  (easy->set).blobs[2] = (curl_blob *)0x0;
  (easy->set).blobs[3] = (curl_blob *)0x0;
  (easy->set).blobs[0] = (curl_blob *)0x0;
  (easy->set).blobs[1] = (curl_blob *)0x0;
  lVar7 = 0;
  do {
    CVar2 = Curl_setblobopt((curl_blob **)((long)(easy->set).blobs + lVar7),
                            *(curl_blob **)((long)(data->set).blobs + lVar7));
    if (CVar2 != CURLE_OK) goto LAB_0052cce5;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x40);
  lVar7 = (data->set).postfieldsize;
  if ((lVar7 == 0) || (pcVar4 = (data->set).str[0x4d], pcVar4 == (char *)0x0)) {
LAB_0052ccbc:
    CVar3 = Curl_mime_duppart(part,&(data->set).mimepost);
    if ((data->set).resolve != (curl_slist *)0x0) {
      (easy->state).resolve = (easy->set).resolve;
    }
  }
  else {
    length = curlx_sotouz(lVar7);
    pcVar4 = (char *)Curl_memdup(pcVar4,length);
    (easy->set).str[0x4d] = pcVar4;
    if (pcVar4 != (char *)0x0) {
      (easy->set).postfields = pcVar4;
      goto LAB_0052ccbc;
    }
  }
LAB_0052cce5:
  if (CVar3 == CURLE_OK) {
    Curl_dyn_init(&(easy->state).headerb,0x19000);
    (easy->state).conn_cache = (conncache *)0x0;
    (easy->state).lastconnect_id = -1;
    (easy->progress).flags = (data->progress).flags;
    (easy->progress).field_0x184 =
         (easy->progress).field_0x184 & 0xfe | (data->progress).field_0x184 & 1;
    if (data->cookies != (CookieInfo *)0x0) {
      pCVar5 = Curl_cookie_init(data,data->cookies->filename,easy->cookies,
                                SUB41((*(uint *)&(data->set).field_0x8e2 & 4) >> 2,0));
      easy->cookies = pCVar5;
      if (pCVar5 == (CookieInfo *)0x0) goto LAB_0052cced;
    }
    pcVar6 = (data->state).cookielist;
    if (pcVar6 != (curl_slist *)0x0) {
      pcVar6 = Curl_slist_duplicate(pcVar6);
      (easy->state).cookielist = pcVar6;
      if (pcVar6 == (curl_slist *)0x0) goto LAB_0052cced;
    }
    pcVar4 = (data->state).url;
    if (pcVar4 != (char *)0x0) {
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      (easy->state).url = pcVar4;
      if (pcVar4 == (char *)0x0) goto LAB_0052cced;
      puVar1 = &(easy->state).field_0x6d2;
      *puVar1 = *puVar1 | 2;
    }
    pcVar4 = (data->state).referer;
    if (pcVar4 != (char *)0x0) {
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      (easy->state).referer = pcVar4;
      if (pcVar4 == (char *)0x0) goto LAB_0052cced;
      puVar1 = &(easy->state).field_0x6d2;
      *puVar1 = *puVar1 | 4;
    }
    pcVar4 = (easy->set).str[0x29];
    if ((pcVar4 == (char *)0x0) || (CVar3 = Curl_ssl_set_engine(easy,pcVar4), CVar3 == CURLE_OK)) {
      Curl_initinfo(easy);
      easy->magic = 0xc0dedbad;
      return easy;
    }
  }
LAB_0052cced:
  curl_slist_free_all((easy->state).cookielist);
  (easy->state).cookielist = (curl_slist *)0x0;
  (*Curl_cfree)((easy->state).buffer);
  (easy->state).buffer = (char *)0x0;
  Curl_dyn_free(&(easy->state).headerb);
  (*Curl_cfree)((easy->state).url);
  (easy->state).url = (char *)0x0;
  (*Curl_cfree)((easy->state).referer);
  (easy->state).referer = (char *)0x0;
  Curl_freeset(easy);
  (*Curl_cfree)(easy);
  return (CURL_conflict *)0x0;
}

Assistant:

struct Curl_easy *curl_easy_duphandle(struct Curl_easy *data)
{
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(!outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  Curl_dyn_init(&outcurl->state.headerb, CURL_MAX_HTTP_HEADER);

  /* the connection cache is setup on demand */
  outcurl->state.conn_cache = NULL;
  outcurl->state.lastconnect_id = -1;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

#ifndef CURL_DISABLE_COOKIES
  if(data->cookies) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(data,
                                        data->cookies->filename,
                                        outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  /* duplicate all values in 'change' */
  if(data->state.cookielist) {
    outcurl->state.cookielist =
      Curl_slist_duplicate(data->state.cookielist);
    if(!outcurl->state.cookielist)
      goto fail;
  }
#endif

  if(data->state.url) {
    outcurl->state.url = strdup(data->state.url);
    if(!outcurl->state.url)
      goto fail;
    outcurl->state.url_alloc = TRUE;
  }

  if(data->state.referer) {
    outcurl->state.referer = strdup(data->state.referer);
    if(!outcurl->state.referer)
      goto fail;
    outcurl->state.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi) {
    outcurl->asi = Curl_altsvc_init();
    if(!outcurl->asi)
      goto fail;
    if(outcurl->set.str[STRING_ALTSVC])
      (void)Curl_altsvc_load(outcurl->asi, outcurl->set.str[STRING_ALTSVC]);
  }
#endif
#ifndef CURL_DISABLE_HSTS
  if(data->hsts) {
    outcurl->hsts = Curl_hsts_init();
    if(!outcurl->hsts)
      goto fail;
    if(outcurl->set.str[STRING_HSTS])
      (void)Curl_hsts_loadfile(outcurl,
                               outcurl->hsts, outcurl->set.str[STRING_HSTS]);
    (void)Curl_hsts_loadcb(outcurl, outcurl->hsts);
  }
#endif
  /* Clone the resolver handle, if present, for the new handle */
  if(Curl_resolver_duphandle(outcurl,
                             &outcurl->state.async.resolver,
                             data->state.async.resolver))
    goto fail;

#ifdef USE_ARES
  {
    CURLcode rc;

    rc = Curl_set_dns_servers(outcurl, data->set.str[STRING_DNS_SERVERS]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_interface(outcurl, data->set.str[STRING_DNS_INTERFACE]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_local_ip4(outcurl, data->set.str[STRING_DNS_LOCAL_IP4]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_local_ip6(outcurl, data->set.str[STRING_DNS_LOCAL_IP6]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;
  }
#endif /* USE_ARES */

  Curl_initinfo(outcurl);

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

  fail:

  if(outcurl) {
#ifndef CURL_DISABLE_COOKIES
    curl_slist_free_all(outcurl->state.cookielist);
    outcurl->state.cookielist = NULL;
#endif
    Curl_safefree(outcurl->state.buffer);
    Curl_dyn_free(&outcurl->state.headerb);
    Curl_safefree(outcurl->state.url);
    Curl_safefree(outcurl->state.referer);
    Curl_altsvc_cleanup(&outcurl->asi);
    Curl_hsts_cleanup(&outcurl->hsts);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}